

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::UninterpretedOption::ByteSize(UninterpretedOption *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 0x1fe) == 0) {
    iVar3 = 0;
  }
  else {
    iVar6 = 0;
    if ((uVar4 & 2) != 0) {
      psVar1 = this->identifier_value_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar3 = 1;
      if (0x7f < uVar5) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        uVar5 = (uint)psVar1->_M_string_length;
        uVar4 = this->_has_bits_[0];
      }
      iVar6 = uVar5 + iVar3 + 1;
    }
    if ((uVar4 & 4) != 0) {
      iVar3 = io::CodedOutputStream::VarintSize64(this->positive_int_value_);
      iVar6 = iVar6 + iVar3 + 1;
      uVar4 = this->_has_bits_[0];
    }
    if ((uVar4 & 8) != 0) {
      iVar3 = io::CodedOutputStream::VarintSize64(this->negative_int_value_);
      iVar6 = iVar6 + iVar3 + 1;
      uVar4 = this->_has_bits_[0];
    }
    iVar3 = iVar6 + 9;
    if ((uVar4 & 0x10) == 0) {
      iVar3 = iVar6;
    }
    if ((uVar4 & 0x20) != 0) {
      psVar1 = this->string_value_;
      uVar5 = (uint)psVar1->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar5) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
        uVar5 = (uint)psVar1->_M_string_length;
        uVar4 = this->_has_bits_[0];
      }
      iVar3 = iVar3 + uVar5 + iVar6 + 1;
    }
    if ((uVar4 & 0x40) != 0) {
      psVar1 = this->aggregate_value_;
      uVar4 = (uint)psVar1->_M_string_length;
      iVar6 = 1;
      if (0x7f < uVar4) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar4);
        uVar4 = (uint)psVar1->_M_string_length;
      }
      iVar3 = iVar3 + uVar4 + iVar6 + 1;
    }
  }
  iVar6 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = iVar3 + iVar6;
  if (0 < iVar6) {
    lVar7 = 0;
    do {
      uVar4 = UninterpretedOption_NamePart::ByteSize
                        ((UninterpretedOption_NamePart *)
                         (this->name_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar6 = 1;
      if (0x7f < uVar4) {
        iVar6 = io::CodedOutputStream::VarintSize32Fallback(uVar4);
      }
      iVar3 = iVar3 + uVar4 + iVar6;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->name_).super_RepeatedPtrFieldBase.current_size_);
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar6 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar6 + iVar3;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int UninterpretedOption::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    // optional string identifier_value = 3;
    if (has_identifier_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->identifier_value());
    }

    // optional uint64 positive_int_value = 4;
    if (has_positive_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt64Size(
          this->positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (has_negative_int_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int64Size(
          this->negative_int_value());
    }

    // optional double double_value = 6;
    if (has_double_value()) {
      total_size += 1 + 8;
    }

    // optional bytes string_value = 7;
    if (has_string_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this->string_value());
    }

    // optional string aggregate_value = 8;
    if (has_aggregate_value()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->aggregate_value());
    }

  }
  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  total_size += 1 * this->name_size();
  for (int i = 0; i < this->name_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->name(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}